

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DatatypeValidatorFactory::serialize
          (DatatypeValidatorFactory *this,XSerializeEngine *serEng)

{
  if (serEng->fStoreLoad != 0) {
    XTemplateSerializer::loadObject(&this->fUserDefinedRegistry,0x1d,true,serEng);
    return;
  }
  XTemplateSerializer::storeObject(this->fUserDefinedRegistry,serEng);
  return;
}

Assistant:

void DatatypeValidatorFactory::serialize(XSerializeEngine& serEng)
{

    // Need not to serialize static data member, fBuiltInRegistry

    if (serEng.isStoring())
    {
        /***
         * Serialize RefHashTableOf<DatatypeValidator>
         ***/
        XTemplateSerializer::storeObject(fUserDefinedRegistry, serEng);
    }
    else
    {
        /***
         * Deserialize RefHashTableOf<DatatypeValidator>
         ***/
        XTemplateSerializer::loadObject(&fUserDefinedRegistry, 29, true, serEng);
    }

}